

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point.cpp
# Opt level: O3

int __thiscall CPoint::IsPin(CPoint *this)

{
  undefined2 uVar1;
  undefined2 uVar3;
  undefined1 uVar5;
  ulong uVar2;
  undefined3 uVar8;
  CObject *pCVar9;
  CNet *this_00;
  int iVar10;
  int iVar11;
  int iVar12;
  CPin *pCVar13;
  uint uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 uVar4;
  undefined4 uVar6;
  undefined3 uVar7;
  
  pCVar9 = (this->super_CObject).m_pParent;
  if (pCVar9 == (CObject *)0x0) {
    __assert_fail("GetParent()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Point.cpp"
                  ,0xf9,"int CPoint::IsPin()");
  }
  this_00 = (CNet *)pCVar9->m_pParent;
  if (this_00 == (CNet *)0x0) {
    __assert_fail("pNet",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Point.cpp"
                  ,0xfb,"int CPoint::IsPin()");
  }
  iVar10 = CNet::GetNumPin(this_00);
  if (iVar10 < 1) {
    uVar14 = 0;
  }
  else {
    iVar10 = 0;
    do {
      pCVar13 = CNet::GetPin(this_00,iVar10);
      uVar2._0_2_ = (pCVar13->super_CPoint).m_iY;
      uVar2._2_2_ = (pCVar13->super_CPoint).m_iX;
      uVar4 = (pCVar13->super_CPoint).m_cZ;
      uVar7 = *(undefined3 *)&(pCVar13->super_CPoint).field_0x25;
      uVar2._4_4_ = CONCAT31(uVar7,uVar4);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = uVar2;
      uVar1 = this->m_iY;
      uVar3 = this->m_iX;
      uVar5 = this->m_cZ;
      uVar8 = *(undefined3 *)&this->field_0x25;
      uVar6 = CONCAT31(uVar8,uVar5);
      auVar17._0_2_ = -(ushort)(uVar1 == (undefined2)uVar2);
      auVar17._2_2_ = -(ushort)(uVar3 == uVar2._2_2_);
      auVar17._4_2_ = -(ushort)((short)uVar6 == (short)uVar2._4_4_);
      auVar17._6_2_ = -(ushort)((short)((uint3)uVar8 >> 8) == (short)((uint3)uVar7 >> 8));
      auVar17._8_2_ = 0xffff;
      auVar17._10_2_ = 0xffff;
      auVar17._12_2_ = 0xffff;
      auVar17._14_2_ = 0xffff;
      auVar15 = pshuflw(auVar15,auVar17,0x50);
      auVar16._0_4_ = auVar15._0_4_;
      auVar16._4_4_ = auVar16._0_4_;
      auVar16._8_4_ = auVar15._4_4_;
      auVar16._12_4_ = auVar15._4_4_;
      iVar11 = movmskpd((int)pCVar13,auVar16);
      if (iVar11 == 3) break;
      iVar10 = iVar10 + 1;
      iVar12 = CNet::GetNumPin(this_00);
    } while (iVar10 < iVar12);
    uVar14 = (uint)(iVar11 == 3);
  }
  return uVar14;
}

Assistant:

CWire* CPoint::GetParent()
{
	return	(CWire*)m_pParent;
}